

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_paeth_predictor_16x32_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  
  uVar1 = above[-1];
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar2 = above[lVar7];
      uVar4 = (uint)left[lVar6] - (uint)uVar1;
      uVar9 = (uint)uVar2 - (uint)uVar1;
      uVar3 = -uVar9;
      if (0 < (int)uVar9) {
        uVar3 = uVar9;
      }
      uVar9 = -uVar4;
      if (0 < (int)uVar4) {
        uVar9 = uVar4;
      }
      uVar5 = (uVar4 + uVar2) - (uint)uVar1;
      uVar4 = -uVar5;
      if (0 < (int)uVar5) {
        uVar4 = uVar5;
      }
      if (uVar4 < uVar9) {
        uVar2 = uVar1;
      }
      uVar8 = left[lVar6];
      if (uVar4 < uVar3) {
        uVar8 = uVar2;
      }
      if (uVar9 < uVar3) {
        uVar8 = uVar2;
      }
      dst[lVar7] = uVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    lVar6 = lVar6 + 1;
    dst = dst + stride;
  } while (lVar6 != 0x20);
  return;
}

Assistant:

static inline void highbd_paeth_predictor(uint16_t *dst, ptrdiff_t stride,
                                          int bw, int bh, const uint16_t *above,
                                          const uint16_t *left, int bd) {
  int r, c;
  const uint16_t ytop_left = above[-1];
  (void)bd;

  for (r = 0; r < bh; r++) {
    for (c = 0; c < bw; c++)
      dst[c] = paeth_predictor_single(left[r], above[c], ytop_left);
    dst += stride;
  }
}